

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O0

void parsePSPFile(filebuf *file)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  ushort uVar4;
  size_type sVar5;
  bool bVar6;
  uint uVar7;
  optional<Rgba> oVar8;
  size_type sVar9;
  char *pcVar10;
  unsigned_short *puVar11;
  Rgba *pRVar12;
  reference this;
  reference pvVar13;
  _Storage<Rgba,_true> local_57;
  undefined1 local_53;
  ushort local_52;
  undefined1 uStack_50;
  optional<Rgba> color;
  uint16_t i;
  size_type sStack_48;
  optional<unsigned_short> nbColors;
  size_type n;
  undefined1 local_30 [8];
  string line;
  filebuf *file_local;
  
  line.field_2._8_8_ = file;
  std::__cxx11::string::string((string *)local_30);
  readLine((filebuf *)line.field_2._8_8_,(string *)local_30);
  bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"JASC-PAL");
  if (((bVar6 ^ 0xffU) & 1) == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    readLine((filebuf *)line.field_2._8_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"0100");
    if (((bVar6 ^ 0xffU) & 1) == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
      readLine((filebuf *)line.field_2._8_8_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
      sStack_48 = 0;
      register0x00000000 =
           (_Optional_payload_base<unsigned_short>)
           parseDec<unsigned_short>((string *)local_30,&stack0xffffffffffffffb8);
      bVar6 = std::optional::operator_cast_to_bool
                        ((optional *)
                         &color.super__Optional_base<Rgba,_true,_true>._M_payload.
                          super__Optional_payload_base<Rgba>._M_payload._M_value.alpha);
      sVar5 = sStack_48;
      if ((bVar6) &&
         (sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_30), sVar5 == sVar9)) {
        puVar11 = std::optional<unsigned_short>::operator*
                            ((optional<unsigned_short> *)
                             ((long)&color.super__Optional_base<Rgba,_true,_true>._M_payload.
                                     super__Optional_payload_base<Rgba>._M_payload + 3));
        if ((ushort)((ushort)options.nbColorsPerPal * (ushort)options.nbPalettes) < *puVar11) {
          puVar11 = std::optional<unsigned_short>::operator*
                              ((optional<unsigned_short> *)
                               ((long)&color.super__Optional_base<Rgba,_true,_true>._M_payload.
                                       super__Optional_payload_base<Rgba>._M_payload + 3));
          warning("PSP file contains %u colors, but there can only be %u; ignoring extra",
                  (ulong)*puVar11,(ulong)((uint)options.nbColorsPerPal * (uint)options.nbPalettes));
          _uStack_50 = (uint)options.nbColorsPerPal * (uint)options.nbPalettes;
          std::optional<unsigned_short>::operator=
                    ((optional<unsigned_short> *)
                     ((long)&color.super__Optional_base<Rgba,_true,_true>._M_payload.
                             super__Optional_payload_base<Rgba>._M_payload + 3),(int *)&uStack_50);
        }
        std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::clear
                  (&options.palSpec);
        for (local_52 = 0; uVar4 = local_52,
            puVar11 = std::optional<unsigned_short>::operator*
                                ((optional<unsigned_short> *)
                                 ((long)&color.super__Optional_base<Rgba,_true,_true>._M_payload.
                                         super__Optional_payload_base<Rgba>._M_payload + 3)),
            uVar4 < *puVar11; local_52 = local_52 + 1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
          readLine((filebuf *)line.field_2._8_8_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
          sStack_48 = 0;
          oVar8 = parseColor((string *)local_30,&stack0xffffffffffffffb8,local_52 + 1);
          local_57 = oVar8.super__Optional_base<Rgba,_true,_true>._M_payload.
                     super__Optional_payload_base<Rgba>._M_payload;
          local_53 = oVar8.super__Optional_base<Rgba,_true,_true>._M_payload.
                     super__Optional_payload_base<Rgba>._M_engaged;
          bVar6 = std::optional::operator_cast_to_bool((optional *)&local_57._M_value);
          sVar5 = sStack_48;
          if (!bVar6) break;
          sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_30);
          if (sVar5 != sVar9) {
            uVar7 = (uint)local_52;
            pcVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_30);
            error("Failed to parse color #%u (\"%s\"): trailing characters after blue component",
                  (ulong)(uVar7 + 1),pcVar10);
            break;
          }
          if ((int)((ulong)local_52 % (ulong)(long)(int)(uint)options.nbColorsPerPal) == 0) {
            std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
            emplace_back<>(&options.palSpec);
          }
          pRVar12 = std::optional<Rgba>::operator*((optional<Rgba> *)&local_57._M_value);
          this = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::back
                           (&options.palSpec);
          pvVar13 = std::array<Rgba,_4UL>::operator[]
                              (this,(long)(int)((ulong)local_52 %
                                               (ulong)(long)(int)(uint)options.nbColorsPerPal));
          uVar1 = pRVar12->green;
          uVar2 = pRVar12->blue;
          uVar3 = pRVar12->alpha;
          pvVar13->red = pRVar12->red;
          pvVar13->green = uVar1;
          pvVar13->blue = uVar2;
          pvVar13->alpha = uVar3;
        }
      }
      else {
        pcVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_30);
        error("Invalid \"number of colors\" line in PSP file (%s)",pcVar10);
      }
    }
    else {
      pcVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30)
      ;
      error("Unsupported PSP palette file version \"%s\"",pcVar10);
    }
  }
  else {
    error("Palette file does not appear to be a PSP palette file");
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

static void parsePSPFile(std::filebuf &file) {
	// https://www.selapa.net/swatches/colors/fileformats.php#psp_pal

	std::string line;
	readLine(file, line);
	if (line != "JASC-PAL") {
		error("Palette file does not appear to be a PSP palette file");
		return;
	}

	line.clear();
	readLine(file, line);
	if (line != "0100") {
		error("Unsupported PSP palette file version \"%s\"", line.c_str());
		return;
	}

	line.clear();
	readLine(file, line);
	std::string::size_type n = 0;
	std::optional<uint16_t> nbColors = parseDec<uint16_t>(line, n);
	if (!nbColors || n != line.length()) {
		error("Invalid \"number of colors\" line in PSP file (%s)", line.c_str());
		return;
	}

	if (*nbColors > options.nbColorsPerPal * options.nbPalettes) {
		warning("PSP file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        *nbColors, options.nbColorsPerPal * options.nbPalettes);
		nbColors = options.nbColorsPerPal * options.nbPalettes;
	}

	options.palSpec.clear();

	for (uint16_t i = 0; i < *nbColors; ++i) {
		line.clear();
		readLine(file, line);

		n = 0;
		std::optional<Rgba> color = parseColor(line, n, i + 1);
		if (!color) {
			return;
		}
		if (n != line.length()) {
			error("Failed to parse color #%" PRIu16
			      " (\"%s\"): trailing characters after blue component",
			      i + 1, line.c_str());
			return;
		}

		if (i % options.nbColorsPerPal == 0) {
			options.palSpec.emplace_back();
		}
		options.palSpec.back()[i % options.nbColorsPerPal] = *color;
	}
}